

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

bool __thiscall cmCTestBZR::LoadModifications(cmCTestBZR *this)

{
  pointer *this_00;
  int *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  string local_3a8;
  undefined1 local_388 [8];
  OutputLogger err;
  StatusParser out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [32];
  string local_78 [32];
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_status;
  string bzr;
  cmCTestBZR *this_local;
  
  this_00 = &bzr_status.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string
            ((string *)this_00,
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
  out.RegexStatus.progsize._1_1_ = 1;
  std::__cxx11::string::string((string *)&local_b8,(string *)this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"status",(allocator<char> *)((long)&out.RegexStatus.progsize + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"-SV",(allocator<char> *)((long)&out.RegexStatus.progsize + 2));
  out.RegexStatus.progsize._1_1_ = 0;
  local_58 = &local_b8;
  local_50 = 3;
  this_01 = &out.RegexStatus.progsize;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_01);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48,__l,(allocator_type *)this_01);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&out.RegexStatus.progsize);
  local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
  do {
    local_3e8 = local_3e8 + -1;
    std::__cxx11::string::~string((string *)local_3e8);
  } while (local_3e8 != &local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&out.RegexStatus.progsize + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&out.RegexStatus.progsize + 3));
  StatusParser::StatusParser((StatusParser *)&err.super_LineParser.Separator,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_388,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "status-err> ");
  std::__cxx11::string::string((string *)&local_3a8);
  cmCTestVC::RunChild((cmCTestVC *)this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_48,(OutputParser *)&err.super_LineParser.Separator,
                      (OutputParser *)local_388,&local_3a8,Auto);
  std::__cxx11::string::~string((string *)&local_3a8);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_388);
  StatusParser::~StatusParser((StatusParser *)&err.super_LineParser.Separator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  std::__cxx11::string::~string
            ((string *)
             &bzr_status.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return true;
}

Assistant:

bool cmCTestBZR::LoadModifications()
{
  // Run "bzr status" which reports local modifications.
  std::string bzr = this->CommandLineTool;
  std::vector<std::string> bzr_status = { bzr, "status", "-SV" };
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunChild(bzr_status, &out, &err);
  return true;
}